

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool el::Loggers::configureFromArg(char *argKey)

{
  bool bVar1;
  CommandLineArgs *pCVar2;
  char *globalConfigurationFilePath;
  char *argKey_local;
  
  pCVar2 = Helpers::commandLineArgs();
  bVar1 = el::base::utils::CommandLineArgs::hasParamWithValue(pCVar2,argKey);
  if (bVar1) {
    pCVar2 = Helpers::commandLineArgs();
    globalConfigurationFilePath = el::base::utils::CommandLineArgs::getParamValue(pCVar2,argKey);
    configureFromGlobal(globalConfigurationFilePath);
  }
  return bVar1;
}

Assistant:

bool Loggers::configureFromArg(const char* argKey) {
#if defined(ELPP_DISABLE_CONFIGURATION_FROM_PROGRAM_ARGS)
  ELPP_UNUSED(argKey);
#else
  if (!Helpers::commandLineArgs()->hasParamWithValue(argKey)) {
    return false;
  }
  configureFromGlobal(Helpers::commandLineArgs()->getParamValue(argKey));
#endif  // defined(ELPP_DISABLE_CONFIGURATION_FROM_PROGRAM_ARGS)
  return true;
}